

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

int __thiscall libtorrent::aux::piece_picker::remove(piece_picker *this,char *__filename)

{
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> idx;
  bool bVar1;
  bool bVar2;
  int extraout_EAX;
  value_type *this_00;
  strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void> *psVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  size_type sVar6;
  int in_EDX;
  strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void> local_24;
  piece_index_t piece;
  prio_index_t temp;
  prio_index_t next_index;
  int priority_local;
  piece_picker *this_local;
  prio_index_t elem_index_local;
  
  temp.m_val = (int)__filename;
  piece.m_val = in_EDX;
  this_local._4_4_ = in_EDX;
  do {
    memset(&local_24,0,4);
    do {
      this_00 = container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_int,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>_>
                ::operator[](&this->m_priority_boundaries,temp.m_val);
      psVar3 = strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>::operator--(this_00);
      local_24.m_val = psVar3->m_val;
      temp.m_val = temp.m_val + 1;
      bVar1 = strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>::operator==
                        ((strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void> *)&piece,
                         &local_24);
      bVar2 = false;
      if (bVar1) {
        sVar6 = ::std::
                vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>
                ::size(&(this->m_priority_boundaries).
                        super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>
                      );
        bVar2 = temp.m_val < (int)sVar6;
      }
    } while (bVar2);
    bVar2 = strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>::operator==
                      ((strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void> *)&piece,
                       &local_24);
    if (bVar2) break;
    piece.m_val = local_24.m_val;
    pvVar4 = container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
             ::operator[](&this->m_pieces,local_24);
    idx.m_val = pvVar4->m_val;
    pvVar4 = container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
             ::operator[](&this->m_pieces,this_local._4_4_);
    pvVar4->m_val = idx.m_val;
    pvVar5 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
             ::operator[](&this->m_piece_map,idx);
    (pvVar5->index).m_val = this_local._4_4_;
    this_local._4_4_ = piece.m_val;
    sVar6 = ::std::
            vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>
            ::size(&(this->m_priority_boundaries).
                    super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>
                  );
  } while (temp.m_val != (int)sVar6);
  ::std::
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ::pop_back(&(this->m_pieces).
              super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
            );
  return extraout_EAX;
}

Assistant:

void piece_picker::remove(int priority, prio_index_t elem_index)
	{
		TORRENT_ASSERT(!m_dirty);
		TORRENT_ASSERT(priority >= 0);

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "remove " << m_pieces[elem_index] << " (" << priority << ")" << std::endl;
#endif
		prio_index_t next_index = elem_index;
		TORRENT_ASSERT(m_piece_map[m_pieces[elem_index]].priority(this) == -1);
		for (;;)
		{
#ifdef TORRENT_PICKER_LOG
			print_pieces(*this);
#endif
			TORRENT_ASSERT(elem_index < m_pieces.end_index());
			prio_index_t temp{};
			do
			{
				temp = --m_priority_boundaries[priority];
				++priority;
			} while (next_index == temp && priority < int(m_priority_boundaries.size()));
			if (next_index == temp) break;
			next_index = temp;

			piece_index_t const piece = m_pieces[next_index];
			m_pieces[elem_index] = piece;
			m_piece_map[piece].index = elem_index;
			TORRENT_ASSERT(m_piece_map[piece].priority(this) == priority - 1);
			TORRENT_ASSERT(elem_index < prev(m_pieces.end_index()));
			elem_index = next_index;

			if (priority == int(m_priority_boundaries.size()))
				break;
		}
		m_pieces.pop_back();
		TORRENT_ASSERT(next_index == m_pieces.end_index());
#ifdef TORRENT_PICKER_LOG
		print_pieces(*this);
#endif
	}